

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> * __thiscall
AlignmentRecord::coveredPositions
          (vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           *__return_storage_ptr__,AlignmentRecord *this)

{
  pointer pcVar1;
  char cVar2;
  int iVar3;
  ShortDnaSequence *pSVar4;
  uint uVar5;
  uint uVar6;
  mapValue local_60;
  ShortDnaSequence *local_48;
  ShortDnaSequence *local_40;
  AlignmentRecord *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = this->start1;
  pSVar4 = &this->sequence1;
  iVar3 = 0;
  uVar6 = 0;
  local_48 = pSVar4;
  local_38 = this;
  while( true ) {
    pcVar1 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1) <= (ulong)uVar6)
    break;
    cVar2 = pcVar1[uVar6];
    if (cVar2 == 'D') {
      uVar5 = uVar5 + 1;
    }
    else if ((cVar2 == 'I') || (cVar2 == 'S')) {
      iVar3 = iVar3 + 1;
    }
    else if (cVar2 == 'M') {
      cVar2 = ShortDnaSequence::operator[](pSVar4,(long)iVar3);
      local_60.qual = ShortDnaSequence::qualityChar(pSVar4,(long)iVar3);
      local_60.prob =
           (double)*(float *)((anonymous_namespace)::error_probs + (long)local_60.qual * 4);
      local_60.read = 0;
      local_60.ref = uVar5;
      local_60.base = cVar2;
      local_60.pir = iVar3;
      std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
      emplace_back<AlignmentRecord::mapValue>(__return_storage_ptr__,&local_60);
      iVar3 = iVar3 + 1;
      uVar5 = uVar5 + 1;
      pSVar4 = local_48;
      this = local_38;
    }
    uVar6 = uVar6 + 1;
  }
  if (this->single_end == false) {
    uVar5 = this->start2;
    pSVar4 = &this->sequence2;
    iVar3 = 0;
    uVar6 = 0;
    local_40 = pSVar4;
    while( true ) {
      pcVar1 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1) <= (ulong)uVar6)
      break;
      cVar2 = pcVar1[uVar6];
      if (cVar2 == 'D') {
        uVar5 = uVar5 + 1;
      }
      else if ((cVar2 == 'I') || (cVar2 == 'S')) {
        iVar3 = iVar3 + 1;
      }
      else if (cVar2 == 'M') {
        local_48 = (ShortDnaSequence *)CONCAT44(local_48._4_4_,iVar3);
        cVar2 = ShortDnaSequence::operator[](pSVar4,(long)iVar3);
        local_60.qual = ShortDnaSequence::qualityChar(pSVar4,(long)iVar3);
        local_60.prob =
             (double)*(float *)((anonymous_namespace)::error_probs + (long)local_60.qual * 4);
        iVar3 = (int)local_48;
        local_60.pir = (int)local_48;
        local_60.read = 1;
        local_60.ref = uVar5;
        local_60.base = cVar2;
        std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
        emplace_back<AlignmentRecord::mapValue>(__return_storage_ptr__,&local_60);
        iVar3 = iVar3 + 1;
        uVar5 = uVar5 + 1;
        pSVar4 = local_40;
      }
      uVar6 = uVar6 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<AlignmentRecord::mapValue> AlignmentRecord::coveredPositions() const{
    std::vector<AlignmentRecord::mapValue> cov_positions;
    //position in ref
    int r = this->start1;
    //position in querybases / quality string of read
    int q = 0;
    for (unsigned int i = 0; i< this->cigar1_unrolled.size(); ++i){
        char c = this->cigar1_unrolled[i];
        switch(c){
            case 'M': {
                c = this->sequence1[q];
                char qual = this->sequence1.qualityChar(q);
                cov_positions.push_back({r,c,qual,error_probs[qual],q,0});
                //char d = this->sequence1[q];
                ++q;
                ++r;
                break;
            }
            case 'D': {
                ++r;
                break;
            }
            case 'S':
            case 'I': {
                ++q;
                break;
            }
            case 'H':
                break;
        }
    }
    //In case of a paired end read
    if (!this->single_end){
        assert(this->start1 <= this->start2);
            //position in ref
            r = this->start2;
            //position in query bases
            q = 0;
            //in case of overlapping paired end it is declared as a single end
            //if (r <= this->end1){
            //   this->single_end = true;
            //}
            for (unsigned int i = 0; i< this->cigar2_unrolled.size(); ++i){
                char c = this->cigar2_unrolled[i];
                switch(c){
                    case 'M': {
                        c = this->sequence2[q];
                        char qual = this->sequence2.qualityChar(q);
                        cov_positions.push_back({r,c,qual,error_probs[qual],q,1});
                        ++q;
                        ++r;
                        break;
                    }
                    case 'D': {
                        ++r;
                        break;
                    }
                    case 'S':
                    case 'I': {
                        ++q;
                        break;
                    }
                    case 'H':
                        break;
              }
           }
        }
    return cov_positions;
}